

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O3

void __thiscall push_marker_options_t::push_marker_options_t(push_marker_options_t *this)

{
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this,"http://localhost/test01/test01.isml","");
  this->dry_run_ = false;
  this->announce_ = 0;
  this->seg_dur_ = 2000;
  this->avail_interval_ = 60000;
  this->avail_dur_ = 10000;
  this->track_id_ = 1;
  this->timescale_ = 1000;
  this->send_vtt_ = false;
  this->send_event_ = true;
  this->splice_immediate_ = false;
  (this->init_string_)._M_dataplus._M_p = (pointer)&(this->init_string_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->init_string_,"");
  (this->media_string_)._M_dataplus._M_p = (pointer)&(this->media_string_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->media_string_,"");
  return;
}

Assistant:

push_marker_options_t()
        : url_("http://localhost/test01/test01.isml")
        , dry_run_(false)
        , avail_interval_(60000)
        , avail_dur_(10000)
        , seg_dur_(2000)
        , timescale_(1000)
        , track_id_(1)
        , announce_(0)
        , send_vtt_(false)
        , send_event_(true)
        , media_string_("")
        , init_string_("")
        , splice_immediate_(false)
    {
    }